

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

void free_descriptions_metadata(MMDB_s *mmdb)

{
  ulong local_18;
  size_t i;
  MMDB_s *mmdb_local;
  
  if ((mmdb->metadata).description.count != 0) {
    for (local_18 = 0; local_18 < (mmdb->metadata).description.count; local_18 = local_18 + 1) {
      if ((mmdb->metadata).description.descriptions[local_18] != (MMDB_description_s *)0x0) {
        if ((mmdb->metadata).description.descriptions[local_18]->language != (char *)0x0) {
          free((mmdb->metadata).description.descriptions[local_18]->language);
          (mmdb->metadata).description.descriptions[local_18]->language = (char *)0x0;
        }
        if ((mmdb->metadata).description.descriptions[local_18]->description != (char *)0x0) {
          free((mmdb->metadata).description.descriptions[local_18]->description);
          (mmdb->metadata).description.descriptions[local_18]->description = (char *)0x0;
        }
        free((mmdb->metadata).description.descriptions[local_18]);
        (mmdb->metadata).description.descriptions[local_18] = (MMDB_description_s *)0x0;
      }
    }
    free((mmdb->metadata).description.descriptions);
    (mmdb->metadata).description.descriptions = (MMDB_description_s **)0x0;
  }
  return;
}

Assistant:

static void free_descriptions_metadata(MMDB_s *mmdb) {
    if (!mmdb->metadata.description.count) {
        return;
    }

    for (size_t i = 0; i < mmdb->metadata.description.count; i++) {
        if (NULL != mmdb->metadata.description.descriptions[i]) {
            if (NULL != mmdb->metadata.description.descriptions[i]->language) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
                FREE_AND_SET_NULL(
                    mmdb->metadata.description.descriptions[i]->language);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
            }

            if (NULL !=
                mmdb->metadata.description.descriptions[i]->description) {
#if defined(__clang__)
// This is a const char * that we need to free, which isn't valid. However it
// would mean changing the public API to fix this.
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wcast-qual"
#endif
                FREE_AND_SET_NULL(
                    mmdb->metadata.description.descriptions[i]->description);
#if defined(__clang__)
#pragma clang diagnostic pop
#endif
            }
            FREE_AND_SET_NULL(mmdb->metadata.description.descriptions[i]);
        }
    }

    FREE_AND_SET_NULL(mmdb->metadata.description.descriptions);
}